

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sift.cc
# Opt level: O1

void __thiscall features::Sift::create_octaves(Sift *this)

{
  int *piVar1;
  pointer psVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Sift *pSVar3;
  int iVar4;
  int iVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  element_type *peVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  float fVar8;
  ConstPtr local_a8;
  ConstPtr local_98;
  ConstPtr local_88;
  ConstPtr local_78;
  ConstPtr local_68;
  float local_54;
  Sift *local_50;
  element_type *peStack_48;
  Ptr img;
  
  std::vector<features::Sift::Octave,_std::allocator<features::Sift::Octave>_>::_M_erase_at_end
            (&this->octaves,
             (this->octaves).
             super__Vector_base<features::Sift::Octave,_std::allocator<features::Sift::Octave>_>.
             _M_impl.super__Vector_impl_data._M_start);
  if ((this->options).min_octave < 0) {
    local_a8.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (this->orig).super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    local_a8.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (this->orig).super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
    if (local_a8.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_a8.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_a8.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_a8.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_a8.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    core::image::rescale_double_size_supersample<float>((image *)&peStack_48,&local_a8);
    if (local_a8.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_a8.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    local_98.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         peStack_48;
    local_98.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            img.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (img.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        piVar1 = &((img.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_TypedImageBase<float>).super_ImageBase.w;
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      else {
        piVar1 = &((img.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_TypedImageBase<float>).super_ImageBase.w;
        *piVar1 = *piVar1 + 1;
      }
    }
    fVar8 = (this->options).inherent_blur_sigma;
    add_octave(this,&local_98,fVar8 + fVar8,(this->options).base_blur_sigma);
    if (local_98.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (img.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 img.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
  }
  peVar6 = (this->orig).super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  this_01 = (this->orig).super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  iVar4 = (this->options).min_octave;
  local_50 = this;
  if (0 < iVar4) {
    iVar5 = 0;
    p_Var7 = this_01;
    do {
      if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
        }
      }
      local_88.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           peVar6;
      local_88.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = p_Var7;
      core::image::rescale_half_size_gaussian<float>((image *)&peStack_48,&local_88,0.8660254);
      this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                img.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      peVar6 = peStack_48;
      peStack_48 = (element_type *)0x0;
      img.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
      }
      if (img.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   img.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      pSVar3 = local_50;
      if (local_88.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_88.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      iVar5 = iVar5 + 1;
      iVar4 = (pSVar3->options).min_octave;
      p_Var7 = this_01;
    } while (iVar5 < iVar4);
  }
  iVar5 = 0;
  if (0 < iVar4) {
    iVar5 = iVar4;
  }
  if (iVar5 <= (local_50->options).max_octave) {
    fVar8 = (local_50->options).inherent_blur_sigma;
    iVar5 = iVar5 + -1;
    p_Var7 = this_01;
    do {
      pSVar3 = local_50;
      if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
        }
      }
      local_78.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           peVar6;
      local_78.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = p_Var7;
      add_octave(local_50,&local_78,fVar8,(local_50->options).base_blur_sigma);
      if (local_78.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_78.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      psVar2 = (pSVar3->octaves).
               super__Vector_base<features::Sift::Octave,_std::allocator<features::Sift::Octave>_>.
               _M_impl.super__Vector_impl_data._M_finish[-1].img.
               super__Vector_base<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_68.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (psVar2->super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      this_00 = (psVar2->super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
        }
      }
      local_68.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = this_00;
      core::image::rescale_half_size_gaussian<float>((image *)&peStack_48,&local_68,0.8660254);
      this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                img.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      peVar6 = peStack_48;
      peStack_48 = (element_type *)0x0;
      img.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
      }
      if (img.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   img.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      if (local_68.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_68.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      fVar8 = (local_50->options).base_blur_sigma;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        local_54 = fVar8;
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        fVar8 = local_54;
      }
      iVar5 = iVar5 + 1;
      p_Var7 = this_01;
    } while (iVar5 < (local_50->options).max_octave);
  }
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  return;
}

Assistant:

void
Sift::create_octaves (void)
{
    this->octaves.clear();

    /*
     * Create octave -1. The original image is assumed to have blur
     * sigma = 0.5. The double size image therefore has sigma = 1.
     */
    if (this->options.min_octave < 0)
    {
        //std::cout << "Creating octave -1..." << std::endl;
        core::FloatImage::Ptr img
            = core::image::rescale_double_size_supersample<float>(this->orig);
        this->add_octave(img, this->options.inherent_blur_sigma * 2.0f,
            this->options.base_blur_sigma);
    }

    /*
     * Prepare image for the first positive octave by downsampling.
     * This code is executed only if min_octave > 0.
     */
    core::FloatImage::ConstPtr img = this->orig;
    for (int i = 0; i < this->options.min_octave; ++i)
        img = core::image::rescale_half_size_gaussian<float>(img);

    /*
     * Create new octave from 'img', then subsample octave image where
     * sigma is doubled to get a new base image for the next octave.
     */
    float img_sigma = this->options.inherent_blur_sigma;
    for (int i = std::max(0, this->options.min_octave);
        i <= this->options.max_octave; ++i)
    {
        //std::cout << "Creating octave " << i << "..." << std::endl;
        this->add_octave(img, img_sigma, this->options.base_blur_sigma);

        core::FloatImage::ConstPtr pre_base = octaves[octaves.size()-1].img[0];
        img = core::image::rescale_half_size_gaussian<float>(pre_base);

        img_sigma = this->options.base_blur_sigma;
    }
}